

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall ot::commissioner::coap::Coap::HandleResponse(Coap *this,Response *aResponse)

{
  byte bVar1;
  bool bVar2;
  RequestHolder *aRequestHolder;
  char *begin;
  char *pcVar3;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  undefined1 local_168 [8];
  _Alloc_hider _Stack_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  code *local_140;
  string requestUri;
  string local_110;
  Error local_f0;
  Error local_c8;
  undefined1 local_a0 [40];
  undefined1 local_78 [40];
  Error local_50;
  
  std::__cxx11::string::string((string *)&requestUri,"UNKNOWN_URI",(allocator *)local_168);
  aRequestHolder = RequestsCache::Match(&this->mRequestsCache,aResponse);
  if (aRequestHolder == (RequestHolder *)0x0) {
    if ((undefined1  [12])((undefined1  [12])aResponse->mHeader & (undefined1  [12])0x8) !=
        (undefined1  [12])0x0) goto LAB_001c445f;
    SendReset(&local_50,this,aResponse);
    this_00 = &local_50.mMessage;
  }
  else {
    Message::GetUriPath((Error *)local_168,
                        (aRequestHolder->mRequest).
                        super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,&requestUri);
    std::__cxx11::string::~string((string *)&_Stack_160);
    if (4 < (aResponse->mHeader).mCode) {
      Message::SetRequestUri(aResponse,&requestUri);
    }
    switch(*(uint *)&aResponse->mHeader >> 2 & 3) {
    case 0:
      SendAck((Error *)local_a0,this,aResponse);
      std::__cxx11::string::~string((string *)(local_a0 + 8));
    case 1:
      this_00 = &local_f0.mMessage;
      local_f0.mCode = kNone;
      local_f0.mMessage._M_dataplus._M_p = (pointer)&local_f0.mMessage.field_2;
      local_f0.mMessage._M_string_length = 0;
      local_f0.mMessage.field_2._M_local_buf[0] = '\0';
      FinalizeTransaction(this,aRequestHolder,aResponse,&local_f0);
      break;
    case 2:
      bVar1 = (aResponse->mHeader).mCode;
      if (bVar1 == 0) {
        if ((undefined1  [12])
            ((undefined1  [12])
             ((aRequestHolder->mRequest).
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->mHeader & (undefined1  [12])0xc) == (undefined1  [12])0x0) {
          aRequestHolder->mAcknowledged = true;
        }
        if ((aRequestHolder->mHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
          RequestsCache::Eliminate(&this->mRequestsCache,aRequestHolder);
        }
        goto LAB_001c445f;
      }
      if ((bVar1 < 5) ||
         (bVar2 = Message::IsTokenEqual
                            (aResponse,
                             (aRequestHolder->mRequest).
                             super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr), !bVar2)) goto LAB_001c445f;
      this_00 = &local_c8.mMessage;
      local_c8.mCode = kNone;
      local_c8.mMessage._M_dataplus._M_p = (pointer)&local_c8.mMessage.field_2;
      local_c8.mMessage._M_string_length = 0;
      local_c8.mMessage.field_2._M_local_buf[0] = '\0';
      FinalizeTransaction(this,aRequestHolder,aResponse,&local_c8);
      break;
    case 3:
      if ((aResponse->mHeader).mCode != '\0') goto LAB_001c445f;
      local_168._0_4_ = string_type;
      _Stack_160._M_p = "request to {} was reset by peer";
      local_158 = 0x1f;
      local_150._M_allocated_capacity = 0x100000000;
      local_140 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar3 = "request to {} was reset by peer";
      local_150._8_8_ = local_168;
      while (begin = pcVar3, begin != "") {
        pcVar3 = begin + 1;
        if (*begin == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_168);
        }
      }
      local_168 = (undefined1  [8])requestUri._M_dataplus._M_p;
      _Stack_160._M_p = (pointer)requestUri._M_string_length;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_168;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1f;
      ::fmt::v10::vformat_abi_cxx11_(&local_110,(v10 *)"request to {} was reset by peer",fmt,args);
      local_78._0_4_ = kAborted;
      std::__cxx11::string::string((string *)(local_78 + 8),(string *)&local_110);
      FinalizeTransaction(this,aRequestHolder,(Response *)0x0,(Error *)local_78);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      this_00 = &local_110;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001c445f:
  std::__cxx11::string::~string((string *)&requestUri);
  return;
}

Assistant:

void Coap::HandleResponse(Response &aResponse)
{
    const RequestHolder *requestHolder = nullptr;
    std::string          requestUri    = "UNKNOWN_URI";

    requestHolder = mRequestsCache.Match(aResponse);
    if (requestHolder == nullptr)
    {
        if (aResponse.IsConfirmable() || aResponse.IsNonConfirmable())
        {
            IgnoreError(SendReset(aResponse));
        }
        ExitNow();
    }

    requestHolder->mRequest->GetUriPath(requestUri).IgnoreError();
    if (aResponse.IsResponse())
    {
        aResponse.SetRequestUri(requestUri);
    }

    switch (aResponse.GetType())
    {
    case Type::kReset:
        if (aResponse.IsEmpty())
        {
            FinalizeTransaction(*requestHolder, nullptr, ERROR_ABORTED("request to {} was reset by peer", requestUri));
        }

        // Silently ignore non-empty reset messages (RFC 7252, p. 4.2).
        break;

    case Type::kAcknowledgment:
        if (aResponse.IsEmpty())
        {
            // Empty acknowledgment.
            if (requestHolder->mRequest->IsConfirmable())
            {
                requestHolder->mAcknowledged = true;
            }

            // Remove the message if response is not expected, otherwise await response.
            if (requestHolder->mHandler == nullptr)
            {
                mRequestsCache.Eliminate(*requestHolder);
            }
        }
        else if (aResponse.IsResponse() && aResponse.IsTokenEqual(*requestHolder->mRequest))
        {
            // Piggybacked response.
            FinalizeTransaction(*requestHolder, &aResponse, ERROR_NONE);
        }

        // Silently ignore acknowledgments carrying requests (RFC 7252, p. 4.2)
        // or with no token match (RFC 7252, p. 5.3.2).
        break;

    case Type::kConfirmable:
        // Send empty ACK if it is a CON message.
        IgnoreError(SendAck(aResponse));

        // fall through

    case Type::kNonConfirmable:
        // Separate response.
        FinalizeTransaction(*requestHolder, &aResponse, ERROR_NONE);
        break;
    }

exit:
    return;
}